

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::OneofMessage::GenerateCopyConstructorCode
          (OneofMessage *this,Printer *p)

{
  LogMessageFatal aLStack_18 [16];
  
  if ((this->super_SingularMessage).has_hasbit_ != true) {
    io::Printer::Emit(p,0x90,
                      "\n    if (from._internal_has_$name$()) {\n      _this->$field_$ =\n          $superclass$::CopyConstruct<$Submsg$>(arena, *from.$field_$);\n    }\n  "
                     );
    return;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (aLStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/cpp/field_generators/message_field.cc"
             ,0x282,0xc,"!has_hasbit_");
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_18);
}

Assistant:

void OneofMessage::GenerateCopyConstructorCode(io::Printer* p) const {
  ABSL_CHECK(!has_hasbit_);
  p->Emit(R"cc(
    if (from._internal_has_$name$()) {
      _this->$field_$ =
          $superclass$::CopyConstruct<$Submsg$>(arena, *from.$field_$);
    }
  )cc");
}